

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::scaleStoredRow(HPresolve *this,HighsInt row,double scale,bool integral)

{
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  uint *puVar4;
  reference pvVar5;
  reference __b;
  byte in_DL;
  int in_ESI;
  HPresolve *in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  HighsLinearSumBounds *in_XMM0_Qa;
  double extraout_XMM0_Qa;
  size_t j;
  double in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  HighsLinearSumBounds *this_01;
  ulong local_28;
  
  this_01 = in_XMM0_Qa;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->row_upper_,(long)in_ESI);
  *pvVar1 = (double)this_01 * *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->row_lower_,(long)in_ESI);
  *pvVar1 = (double)in_XMM0_Qa * *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->implRowDualLower,(long)in_ESI);
  *pvVar1 = *pvVar1 / (double)in_XMM0_Qa;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->implRowDualUpper,(long)in_ESI);
  *pvVar1 = *pvVar1 / (double)in_XMM0_Qa;
  if ((in_DL & 1) != 0) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)in_ESI);
    if ((*pvVar1 != INFINITY) || (NAN(*pvVar1))) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)in_ESI);
      in_stack_ffffffffffffffa8 = round(*pvVar1);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)in_ESI);
      *pvVar1 = in_stack_ffffffffffffffa8;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_lower_,(long)in_ESI);
    if ((*pvVar1 != -INFINITY) || (NAN(*pvVar1))) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)in_ESI);
      in_stack_ffffffffffffffa0 = round(*pvVar1);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)in_ESI);
      *pvVar1 = in_stack_ffffffffffffffa0;
    }
  }
  for (local_28 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->rowpositions),
      local_28 < sVar2; local_28 = local_28 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->rowpositions,local_28);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)*pvVar3)
    ;
    *pvVar1 = (double)in_XMM0_Qa * *pvVar1;
    this_00 = &in_RDI->Avalue;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->rowpositions,local_28);
    std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar3);
    std::abs((int)this_00);
    if (extraout_XMM0_Qa <= (in_RDI->options->super_HighsOptionsStruct).small_matrix_value) {
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&in_RDI->rowpositions,local_28);
      unlink(in_RDI,(char *)(ulong)*puVar4);
    }
  }
  HighsLinearSumBounds::sumScaled
            (this_01,(HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_stack_ffffffffffffffa0)
  ;
  if ((double)in_XMM0_Qa < 0.0) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->rowDualLower,(long)in_ESI);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->rowDualUpper,(long)in_ESI);
    std::swap<double>(pvVar1,pvVar5);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->implRowDualLower,(long)in_ESI);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->implRowDualUpper,(long)in_ESI);
    std::swap<double>(pvVar1,pvVar5);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->rowDualLowerSource,(long)in_ESI);
    __b = std::vector<int,_std::allocator<int>_>::operator[]
                    (&in_RDI->rowDualUpperSource,(long)in_ESI);
    std::swap<int>(pvVar3,__b);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_lower_,(long)in_ESI);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)in_ESI);
    std::swap<double>(pvVar1,pvVar5);
  }
  return;
}

Assistant:

void HPresolve::scaleStoredRow(HighsInt row, double scale, bool integral) {
  model->row_upper_[row] *= scale;
  model->row_lower_[row] *= scale;
  implRowDualLower[row] /= scale;
  implRowDualUpper[row] /= scale;

  if (integral) {
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] = std::round(model->row_upper_[row]);
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] = std::round(model->row_lower_[row]);
  }

  for (size_t j = 0; j < rowpositions.size(); ++j) {
    Avalue[rowpositions[j]] *= scale;
    if (std::abs(Avalue[rowpositions[j]]) <= options->small_matrix_value)
      unlink(rowpositions[j]);
  }

  impliedRowBounds.sumScaled(row, scale);
  if (scale < 0) {
    std::swap(rowDualLower[row], rowDualUpper[row]);
    std::swap(implRowDualLower[row], implRowDualUpper[row]);
    std::swap(rowDualLowerSource[row], rowDualUpperSource[row]);
    std::swap(model->row_lower_[row], model->row_upper_[row]);
  }
}